

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventRegistry.cpp
# Opt level: O2

void __thiscall
license::EventRegistry::addEvent
          (EventRegistry *this,LCC_EVENT_TYPE event,char *licenseLocationId,char *info)

{
  int iVar1;
  pointer paVar2;
  pointer paVar3;
  const_iterator cVar4;
  iterator iVar5;
  mapped_type_conflict1 *pmVar6;
  AuditEvent audit;
  allocator local_561;
  key_type local_560;
  LCC_EVENT_TYPE local_53c;
  value_type local_538;
  
  local_53c = event;
  cVar4 = std::
          _Rb_tree<LCC_EVENT_TYPE,_std::pair<const_LCC_EVENT_TYPE,_int>,_std::_Select1st<std::pair<const_LCC_EVENT_TYPE,_int>_>,_std::less<LCC_EVENT_TYPE>,_std::allocator<std::pair<const_LCC_EVENT_TYPE,_int>_>_>
          ::find((_Rb_tree<LCC_EVENT_TYPE,_std::pair<const_LCC_EVENT_TYPE,_int>,_std::_Select1st<std::pair<const_LCC_EVENT_TYPE,_int>_>,_std::less<LCC_EVENT_TYPE>,_std::allocator<std::pair<const_LCC_EVENT_TYPE,_int>_>_>
                  *)PROGRESS_BY_EVENT_TYPE,&local_53c);
  local_538.severity = (LCC_SEVERITY)(cVar4._M_node == (_Base_ptr)(PROGRESS_BY_EVENT_TYPE + 8));
  local_538.event_type = local_53c;
  if (licenseLocationId == (char *)0x0) {
    builtin_strncpy(local_538.license_reference,"UNDEF",6);
  }
  else {
    strncpy(local_538.license_reference,licenseLocationId,0x400);
  }
  if (info == (char *)0x0) {
    local_538.param2[0] = '\0';
  }
  else {
    strncpy(local_538.param2,info,0xff);
  }
  std::vector<AuditEvent,_std::allocator<AuditEvent>_>::push_back(&this->logs,&local_538);
  if (cVar4._M_node == (_Base_ptr)(PROGRESS_BY_EVENT_TYPE + 8)) {
    std::__cxx11::string::string((string *)&local_560,local_538.license_reference,&local_561);
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
            ::find(&(this->mostAdvancedLogIdx_by_LicenseId)._M_t,&local_560);
    std::__cxx11::string::~string((string *)&local_560);
    if ((_Rb_tree_header *)iVar5._M_node ==
        &(this->mostAdvancedLogIdx_by_LicenseId)._M_t._M_impl.super__Rb_tree_header) {
      return;
    }
    paVar2 = (this->logs).super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
             super__Vector_impl_data._M_finish;
    paVar3 = (this->logs).super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
             super__Vector_impl_data._M_start;
    std::__cxx11::string::string((string *)&local_560,local_538.license_reference,&local_561);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::operator[](&this->mostAdvancedLogIdx_by_LicenseId,&local_560);
    *pmVar6 = ((long)paVar2 - (long)paVar3) / 0x508 - 1;
  }
  else {
    iVar1 = *(int *)&cVar4._M_node[1].field_0x4;
    if (this->current_validation_step < iVar1) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ::clear(&(this->mostAdvancedLogIdx_by_LicenseId)._M_t);
      this->current_validation_step = iVar1;
    }
    else if (iVar1 != this->current_validation_step) {
      return;
    }
    paVar2 = (this->logs).super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
             super__Vector_impl_data._M_finish;
    paVar3 = (this->logs).super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
             super__Vector_impl_data._M_start;
    std::__cxx11::string::string((string *)&local_560,local_538.license_reference,&local_561);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::operator[](&this->mostAdvancedLogIdx_by_LicenseId,&local_560);
    *pmVar6 = ((long)paVar2 - (long)paVar3) / 0x508 - 1;
  }
  std::__cxx11::string::~string((string *)&local_560);
  return;
}

Assistant:

void EventRegistry::addEvent(LCC_EVENT_TYPE event, const char *licenseLocationId, const char *info) {
	AuditEvent audit;
	auto eventIterator = PROGRESS_BY_EVENT_TYPE.find(event);
	bool successEvent = (eventIterator != PROGRESS_BY_EVENT_TYPE.end());
	audit.severity = successEvent ? SVRT_INFO : SVRT_WARN;
	audit.event_type = event;
	if (licenseLocationId == nullptr) {
		strcpy(audit.license_reference, LIC_ID_NOT_DEFINED);
	} else {
		strncpy(audit.license_reference, licenseLocationId, MAX_PATH);
	}
	if (info == nullptr) {
		audit.param2[0] = '\0';
	} else {
		strncpy(audit.param2, info, 255);
	}
	logs.push_back(audit);
	// udpate the status of the log
	if (successEvent) {
		int step = eventIterator->second;
		if (step > current_validation_step) {
			mostAdvancedLogIdx_by_LicenseId.clear();
			current_validation_step = step;
		}

		if (step == current_validation_step) {
			mostAdvancedLogIdx_by_LicenseId[audit.license_reference] = logs.size() - 1;
		}
	} else if (mostAdvancedLogIdx_by_LicenseId.find(audit.license_reference) != mostAdvancedLogIdx_by_LicenseId.end()) {
		mostAdvancedLogIdx_by_LicenseId[audit.license_reference] = logs.size() - 1;
	}
}